

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O3

int floatx80_lt_aarch64(floatx80 a,floatx80 b,float_status *status)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = b.low;
  uVar3 = a.low;
  uVar4 = a.high;
  if ((long)uVar3 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar1 = b.high;
    if (((-1 < (long)uVar2 &&
          ((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) ||
        (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
         (uVar4 & 0x7fff) == 0x7fff)) ||
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        (uVar1 & 0x7fff) == 0x7fff)) goto LAB_005e8951;
    if (-1 < (short)(uVar1 ^ uVar4)) {
      if ((short)uVar4 < 0) {
        bVar5 = uVar1 < uVar4;
        bVar6 = uVar2 < uVar3;
      }
      else {
        bVar5 = uVar4 < uVar1;
        bVar6 = uVar3 < uVar2;
      }
      bVar5 = (bool)(bVar6 & uVar4 == uVar1 | bVar5);
      goto LAB_005e8958;
    }
    if ((short)uVar4 < 0) {
      bVar5 = (((b._8_4_ | a._8_4_) * 2 & 0xffff) != 0 || uVar3 != 0) || uVar2 != 0;
      goto LAB_005e8958;
    }
  }
  else {
LAB_005e8951:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  bVar5 = false;
LAB_005e8958:
  return (int)bVar5;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}